

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void C_InitConsole(int width,int height,bool ingame)

{
  FConsoleBuffer *this;
  int local_18;
  int cheight;
  int cwidth;
  bool ingame_local;
  int height_local;
  int width_local;
  
  vidactive = ingame;
  if (ConFont == (FFont *)0x0) {
    local_18 = 8;
  }
  else {
    local_18 = (*ConFont->_vptr_FFont[3])(ConFont,0x4d);
    FFont::GetHeight(ConFont);
  }
  ConWidth = width + -0x10;
  ConCols = ConWidth / local_18;
  if (conbuffer == (FConsoleBuffer *)0x0) {
    this = (FConsoleBuffer *)operator_new(0x68);
    FConsoleBuffer::FConsoleBuffer(this);
    conbuffer = this;
  }
  return;
}

Assistant:

void C_InitConsole (int width, int height, bool ingame)
{
	int cwidth, cheight;

	vidactive = ingame;
	if (ConFont != NULL)
	{
		cwidth = ConFont->GetCharWidth ('M');
		cheight = ConFont->GetHeight();
	}
	else
	{
		cwidth = cheight = 8;
	}
	ConWidth = (width - LEFTMARGIN - RIGHTMARGIN);
	ConCols = ConWidth / cwidth;

	if (conbuffer == NULL) conbuffer = new FConsoleBuffer;
}